

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

ECDSA_SIG * unpack_cp_signature(uchar *sigbuf,size_t siglen)

{
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  ulong in_RSI;
  uchar *in_RDI;
  BIGNUM *s;
  BIGNUM *r;
  ECDSA_SIG *sig;
  char *in_stack_ffffffffffffffc8;
  undefined8 uVar3;
  ECDSA_SIG *local_8;
  
  uVar3 = 0;
  local_8 = ECDSA_SIG_new();
  if (local_8 == (ECDSA_SIG *)0x0) {
    ERR_GOST_error((int)((ulong)uVar3 >> 0x20),(int)uVar3,in_stack_ffffffffffffffc8,0);
    local_8 = (ECDSA_SIG *)0x0;
  }
  else {
    pBVar1 = BN_bin2bn(in_RDI,(int)(in_RSI >> 1),(BIGNUM *)0x0);
    pBVar2 = BN_bin2bn(in_RDI + (in_RSI >> 1),(int)(in_RSI >> 1),(BIGNUM *)0x0);
    ECDSA_SIG_set0(local_8,pBVar2,pBVar1);
  }
  return (ECDSA_SIG *)local_8;
}

Assistant:

ECDSA_SIG *unpack_cp_signature(const unsigned char *sigbuf, size_t siglen)
{
    ECDSA_SIG *sig;
    BIGNUM *r = NULL, *s = NULL;

    sig = ECDSA_SIG_new();
    if (sig == NULL) {
        GOSTerr(GOST_F_UNPACK_CP_SIGNATURE, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    s = BN_bin2bn(sigbuf, siglen / 2, NULL);
    r = BN_bin2bn(sigbuf + siglen / 2, siglen / 2, NULL);
    ECDSA_SIG_set0(sig, r, s);
    return sig;
}